

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Deserializer.cpp
# Opt level: O3

ControlInfo * __thiscall
adios2::format::BP5Deserializer::GetPriorControl(BP5Deserializer *this,FMFormat Format)

{
  ControlInfo *pCVar1;
  
  pCVar1 = this->ControlBlocks;
  while( true ) {
    if (pCVar1 == (ControlInfo *)0x0) {
      return (ControlInfo *)0x0;
    }
    if (pCVar1->Format == Format) break;
    pCVar1 = pCVar1->Next;
  }
  return pCVar1;
}

Assistant:

BP5Deserializer::ControlInfo *BP5Deserializer::GetPriorControl(FMFormat Format)
{
    struct ControlInfo *tmp = ControlBlocks;
    while (tmp)
    {
        if (tmp->Format == Format)
        {
            return tmp;
        }
        tmp = tmp->Next;
    }
    return NULL;
}